

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_mxu__pool18(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  uint32_t uVar1;
  uint32_t opcode;
  DisasContext_conflict4 *ctx_local;
  CPUMIPSState_conflict2 *env_local;
  
  uVar1 = extract32(ctx->opcode,0x12,3);
  switch(uVar1) {
  case 0:
    generate_exception_end(ctx,0x14);
    break;
  case 1:
    generate_exception_end(ctx,0x14);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 3:
    generate_exception_end(ctx,0x14);
    break;
  case 4:
    generate_exception_end(ctx,0x14);
    break;
  case 5:
    generate_exception_end(ctx,0x14);
    break;
  case 7:
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void decode_opc_mxu__pool18(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 18, 3);

    switch (opcode) {
    case OPC_MXU_D32SLLV:
        /* TODO: Implement emulation of D32SLLV instruction. */
        MIPS_INVAL("OPC_MXU_D32SLLV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_D32SLRV:
        /* TODO: Implement emulation of D32SLRV instruction. */
        MIPS_INVAL("OPC_MXU_D32SLRV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_D32SARV:
        /* TODO: Implement emulation of D32SARV instruction. */
        MIPS_INVAL("OPC_MXU_D32SARV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SLLV:
        /* TODO: Implement emulation of Q16SLLV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SLLV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SLRV:
        /* TODO: Implement emulation of Q16SLRV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SLRV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SARV:
        /* TODO: Implement emulation of Q16SARV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SARV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}